

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

vector<RPCResult,_std::allocator<RPCResult>_> * MempoolEntryDescription(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  string m_key_name_17;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  undefined1 auVar1 [24];
  undefined1 auVar2 [32];
  long lVar3;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined1 in_stack_ffffffffffffed98 [16];
  pointer in_stack_ffffffffffffeda8;
  pointer in_stack_ffffffffffffedb0;
  pointer in_stack_ffffffffffffedb8;
  undefined8 in_stack_ffffffffffffedc0;
  pointer in_stack_ffffffffffffedc8;
  pointer pRVar4;
  pointer in_stack_ffffffffffffedd0;
  pointer pRVar5;
  pointer in_stack_ffffffffffffedd8;
  pointer pRVar6;
  undefined8 in_stack_ffffffffffffede0;
  pointer in_stack_ffffffffffffede8;
  pointer pRVar7;
  allocator<char> local_11fa;
  allocator<char> local_11f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11f8;
  allocator<char> local_11db;
  allocator<char> local_11da;
  allocator_type local_11d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11d8;
  allocator<char> local_11ba;
  allocator<char> local_11b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11b8;
  allocator<char> local_119b;
  allocator<char> local_119a;
  allocator_type local_1199;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1198;
  allocator<char> local_1179;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1178;
  allocator<char> local_1159;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1158;
  allocator<char> local_1139;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1138;
  allocator<char> local_1119;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1118;
  allocator<char> local_10fa;
  allocator<char> local_10f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10f8;
  allocator<char> local_10da;
  allocator<char> local_10d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10d8;
  allocator<char> local_10ba;
  allocator<char> local_10b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10b8;
  allocator<char> local_109a;
  allocator<char> local_1099;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1098;
  allocator<char> local_107a;
  allocator<char> local_1079;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1078;
  allocator<char> local_105a;
  allocator<char> local_1059;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1058;
  allocator<char> local_103a;
  allocator<char> local_1039;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1038;
  allocator<char> local_101a;
  allocator<char> local_1019;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1018;
  allocator<char> local_ffa;
  allocator<char> local_ff9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ff8;
  allocator<char> local_fda;
  allocator<char> local_fd9;
  string local_fd8 [32];
  string local_fb8 [32];
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  RPCResult local_f18;
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  RPCResult local_e10;
  string local_d88 [32];
  string local_d68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  string local_d28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  string local_ce8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  string local_ca8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  string local_c68 [32];
  RPCResult local_c48 [4];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  RPCResult local_7a8 [4];
  RPCResult local_588;
  RPCResult local_500;
  RPCResult local_478;
  RPCResult local_3f0;
  RPCResult local_368;
  RPCResult local_2e0;
  RPCResult local_258;
  RPCResult local_1d0;
  RPCResult local_148;
  RPCResult local_c0;
  long local_38;
  
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"vsize",&local_fd9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e8,
             "virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted."
             ,&local_fda);
  local_ff8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ff8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ff8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description._M_string_length = in_stack_ffffffffffffedc0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffede0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffedd8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(local_7a8,NUM,m_key_name,description,inner,SUB81(local_7c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_808,"weight",&local_ff9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_828,"transaction weight as defined in BIP 141.",&local_ffa);
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_00._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_00._M_string_length = in_stack_ffffffffffffedc0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(local_7a8 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_808,0));
  std::__cxx11::string::string<std::allocator<char>>(local_848,"time",&local_1019);
  std::__cxx11::string::string<std::allocator<char>>
            (local_868,"local time transaction entered pool in seconds since 1 Jan 1970 GMT",
             &local_101a);
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_01._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_01._M_string_length = in_stack_ffffffffffffedc0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (local_7a8 + 2,NUM_TIME,m_key_name_01,description_01,inner_01,SUB81(local_848,0));
  std::__cxx11::string::string<std::allocator<char>>(local_888,"height",&local_1039);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a8,"block height when transaction entered pool",&local_103a);
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_02._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_02._M_string_length = in_stack_ffffffffffffedc0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(local_7a8 + 3,NUM,m_key_name_02,description_02,inner_02,SUB81(local_888,0));
  std::__cxx11::string::string<std::allocator<char>>(local_8c8,"descendantcount",&local_1059);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e8,"number of in-mempool descendant transactions (including this one)",
             &local_105a);
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_03._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_03._M_string_length = in_stack_ffffffffffffedc0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_588,NUM,m_key_name_03,description_03,inner_03,SUB81(local_8c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_908,"descendantsize",&local_1079);
  std::__cxx11::string::string<std::allocator<char>>
            (local_928,"virtual transaction size of in-mempool descendants (including this one)",
             &local_107a);
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_04._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_04._M_string_length = in_stack_ffffffffffffedc0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_500,NUM,m_key_name_04,description_04,inner_04,SUB81(local_908,0));
  std::__cxx11::string::string<std::allocator<char>>(local_948,"ancestorcount",&local_1099);
  std::__cxx11::string::string<std::allocator<char>>
            (local_968,"number of in-mempool ancestor transactions (including this one)",&local_109a
            );
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_05._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_05._M_string_length = in_stack_ffffffffffffedc0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_478,NUM,m_key_name_05,description_05,inner_05,SUB81(local_948,0));
  std::__cxx11::string::string<std::allocator<char>>(local_988,"ancestorsize",&local_10b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9a8,"virtual transaction size of in-mempool ancestors (including this one)",
             &local_10ba);
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_06._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_06._M_string_length = in_stack_ffffffffffffedc0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_3f0,NUM,m_key_name_06,description_06,inner_06,SUB81(local_988,0));
  std::__cxx11::string::string<std::allocator<char>>(local_9c8,"wtxid",&local_10d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9e8,"hash of serialized transaction, including witness data",&local_10da);
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_07._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_07._M_string_length = in_stack_ffffffffffffedc0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_368,STR_HEX,m_key_name_07,description_07,inner_07,SUB81(local_9c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a08,"fees",&local_10f9);
  std::__cxx11::string::string<std::allocator<char>>(local_a28,"",&local_10fa);
  std::__cxx11::string::string<std::allocator<char>>(local_c68,"base",&local_1119);
  std::operator+(&local_c88,"transaction fee, denominated in ",&CURRENCY_UNIT_abi_cxx11_);
  local_1138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_08._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_08._M_string_length = in_stack_ffffffffffffedc0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (local_c48,STR_AMOUNT,m_key_name_08,description_08,inner_08,SUB81(local_c68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ca8,"modified",&local_1139);
  std::operator+(&local_cc8,
                 "transaction fee with fee deltas used for mining priority, denominated in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  local_1158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_09._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_09._M_string_length = in_stack_ffffffffffffedc0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (local_c48 + 1,STR_AMOUNT,m_key_name_09,description_09,inner_09,SUB81(local_ca8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ce8,"ancestor",&local_1159);
  std::operator+(&local_d08,
                 "transaction fees of in-mempool ancestors (including this one) with fee deltas used for mining priority, denominated in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  local_1178.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1178.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1178.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_10._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_10._M_string_length = in_stack_ffffffffffffedc0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (local_c48 + 2,STR_AMOUNT,m_key_name_10,description_10,inner_10,SUB81(local_ce8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d28,"descendant",&local_1179);
  std::operator+(&local_d48,
                 "transaction fees of in-mempool descendants (including this one) with fee deltas used for mining priority, denominated in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  local_1198.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1198.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1198.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_11._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_11._M_string_length = in_stack_ffffffffffffedc0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult
            (local_c48 + 3,STR_AMOUNT,m_key_name_11,description_11,inner_11,SUB81(local_d28,0));
  __l._M_len = 4;
  __l._M_array = local_c48;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1118,__l,&local_1199);
  m_key_name_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_12._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_12._M_string_length = in_stack_ffffffffffffedc0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_2e0,OBJ,m_key_name_12,description_12,inner_12,SUB81(local_a08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d68,"depends",&local_119a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d88,"unconfirmed transactions used as inputs for this transaction",&local_119b);
  std::__cxx11::string::string<std::allocator<char>>(local_e30,"transactionid",&local_11b9);
  std::__cxx11::string::string<std::allocator<char>>(local_e50,"parent transaction id",&local_11ba);
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_13._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_13._M_string_length = in_stack_ffffffffffffedc0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_e10,STR_HEX,m_key_name_13,description_13,inner_13,SUB81(local_e30,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_e10;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_11b8,__l_00,&local_11d9);
  m_key_name_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_14._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_14._M_string_length = in_stack_ffffffffffffedc0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffede8;
  RPCResult::RPCResult(&local_258,ARR,m_key_name_14,description_14,inner_14,SUB81(local_d68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_e70,"spentby",&local_11da);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e90,"unconfirmed transactions spending outputs from this transaction",&local_11db
            );
  std::__cxx11::string::string<std::allocator<char>>(local_f38,"transactionid",&local_11f9);
  std::__cxx11::string::string<std::allocator<char>>(local_f58,"child transaction id",&local_11fa);
  pRVar7 = (pointer)0x0;
  m_key_name_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_15._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_15._M_string_length = in_stack_ffffffffffffedc0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  RPCResult::RPCResult(&local_f18,STR_HEX,m_key_name_15,description_15,inner_15,SUB81(local_f38,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_f18;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_11f8,__l_01,(allocator_type *)&stack0xffffffffffffede7);
  m_key_name_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_16._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_16.field_2._8_8_ = in_stack_ffffffffffffedb0;
  description_16._M_string_length = in_stack_ffffffffffffedc0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedb8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedc8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffedd0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffedd8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar7;
  RPCResult::RPCResult(&local_1d0,ARR,m_key_name_16,description_16,inner_16,SUB81(local_e70,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_f78,"bip125-replaceable",(allocator<char> *)&stack0xffffffffffffede6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f98,
             "Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"
             ,(allocator<char> *)&stack0xffffffffffffede5);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeda8;
  m_key_name_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed98._0_8_;
  m_key_name_17._M_string_length = in_stack_ffffffffffffed98._8_8_;
  m_key_name_17.field_2._8_8_ = in_stack_ffffffffffffedb0;
  auVar1._8_8_ = pRVar7;
  auVar1._0_8_ = in_stack_ffffffffffffede0;
  auVar1._16_8_ = 0;
  RPCResult::RPCResult
            (&local_148,BOOL,m_key_name_17,
             (string)ZEXT1632(CONCAT88(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar1 << 0x40),SUB81(local_f78,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_fb8,"unbroadcast",(allocator<char> *)&stack0xffffffffffffedc7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fd8,
             "Whether this transaction is currently unbroadcast (initial broadcast not yet acknowledged by any peers)"
             ,(allocator<char> *)&stack0xffffffffffffedc6);
  auVar2._8_8_ = pRVar4;
  auVar2._0_8_ = in_stack_ffffffffffffedc0;
  auVar2._16_8_ = pRVar5;
  auVar2._24_8_ = 0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffede0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar6;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar7;
  RPCResult::RPCResult
            (&local_c0,BOOL,(string)ZEXT1632(in_stack_ffffffffffffed98),(string)(auVar2 << 0x40),
             inner_17,SUB81(local_fb8,0));
  __l_02._M_len = 0xe;
  __l_02._M_array = local_7a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_RDI,__l_02,(allocator_type *)&stack0xffffffffffffeda7);
  lVar3 = 0x6e8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_7a8[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeda8);
  std::__cxx11::string::~string(local_fd8);
  std::__cxx11::string::~string(local_fb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedc8);
  std::__cxx11::string::~string(local_f98);
  std::__cxx11::string::~string(local_f78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11f8);
  RPCResult::~RPCResult(&local_f18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffede8);
  std::__cxx11::string::~string(local_f58);
  std::__cxx11::string::~string(local_f38);
  std::__cxx11::string::~string(local_e90);
  std::__cxx11::string::~string(local_e70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11b8);
  RPCResult::~RPCResult(&local_e10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11d8);
  std::__cxx11::string::~string(local_e50);
  std::__cxx11::string::~string(local_e30);
  std::__cxx11::string::~string(local_d88);
  std::__cxx11::string::~string(local_d68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1118);
  lVar3 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_c48[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1198);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string(local_d28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1178);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string(local_ce8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1158);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string(local_ca8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1138);
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::~string(local_c68);
  std::__cxx11::string::~string(local_a28);
  std::__cxx11::string::~string(local_a08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10f8);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_9c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10d8);
  std::__cxx11::string::~string(local_9a8);
  std::__cxx11::string::~string(local_988);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10b8);
  std::__cxx11::string::~string(local_968);
  std::__cxx11::string::~string(local_948);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1098);
  std::__cxx11::string::~string(local_928);
  std::__cxx11::string::~string(local_908);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1078);
  std::__cxx11::string::~string(local_8e8);
  std::__cxx11::string::~string(local_8c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1058);
  std::__cxx11::string::~string(local_8a8);
  std::__cxx11::string::~string(local_888);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1038);
  std::__cxx11::string::~string(local_868);
  std::__cxx11::string::~string(local_848);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1018);
  std::__cxx11::string::~string(local_828);
  std::__cxx11::string::~string(local_808);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ff8);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::string::~string(local_7c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> MempoolEntryDescription()
{
    return {
        RPCResult{RPCResult::Type::NUM, "vsize", "virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted."},
        RPCResult{RPCResult::Type::NUM, "weight", "transaction weight as defined in BIP 141."},
        RPCResult{RPCResult::Type::NUM_TIME, "time", "local time transaction entered pool in seconds since 1 Jan 1970 GMT"},
        RPCResult{RPCResult::Type::NUM, "height", "block height when transaction entered pool"},
        RPCResult{RPCResult::Type::NUM, "descendantcount", "number of in-mempool descendant transactions (including this one)"},
        RPCResult{RPCResult::Type::NUM, "descendantsize", "virtual transaction size of in-mempool descendants (including this one)"},
        RPCResult{RPCResult::Type::NUM, "ancestorcount", "number of in-mempool ancestor transactions (including this one)"},
        RPCResult{RPCResult::Type::NUM, "ancestorsize", "virtual transaction size of in-mempool ancestors (including this one)"},
        RPCResult{RPCResult::Type::STR_HEX, "wtxid", "hash of serialized transaction, including witness data"},
        RPCResult{RPCResult::Type::OBJ, "fees", "",
            {
                RPCResult{RPCResult::Type::STR_AMOUNT, "base", "transaction fee, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "modified", "transaction fee with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "ancestor", "transaction fees of in-mempool ancestors (including this one) with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "descendant", "transaction fees of in-mempool descendants (including this one) with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
            }},
        RPCResult{RPCResult::Type::ARR, "depends", "unconfirmed transactions used as inputs for this transaction",
            {RPCResult{RPCResult::Type::STR_HEX, "transactionid", "parent transaction id"}}},
        RPCResult{RPCResult::Type::ARR, "spentby", "unconfirmed transactions spending outputs from this transaction",
            {RPCResult{RPCResult::Type::STR_HEX, "transactionid", "child transaction id"}}},
        RPCResult{RPCResult::Type::BOOL, "bip125-replaceable", "Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"},
        RPCResult{RPCResult::Type::BOOL, "unbroadcast", "Whether this transaction is currently unbroadcast (initial broadcast not yet acknowledged by any peers)"},
    };
}